

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

string * vkt::SpirVAssembly::repeatString(string *__return_storage_ptr__,string *str,int times)

{
  undefined4 local_24;
  int i;
  int times_local;
  string *str_local;
  string *filler;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_24 = 0; local_24 < times; local_24 = local_24 + 1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

const string repeatString (const string& str, int times)
{
	string filler;
	for (int i = 0; i < times; ++i)
	{
		filler += str;
	}
	return filler;
}